

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.h
# Opt level: O3

void __thiscall
booster::callback<void(std::error_code_const&)>::
callback<cppcms::util::details::binderX<cppcms::session_pool::gc_job,std::shared_ptr<cppcms::session_pool::gc_job>,std::error_code_const&>>
          (callback<void(std::error_code_const&)> *this,
          binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
          *func)

{
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  *this_00;
  binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>
  local_48;
  
  this_00 = (callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
             *)operator_new(0x30);
  local_48.member = func->member;
  local_48._8_8_ = *(undefined8 *)&func->field_0x8;
  local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (func->object).
           super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (func->object).super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.object.
            super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.object.
            super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>._M_refcount
           ._M_pi)->_M_use_count + 1;
    }
  }
  callback<void_(const_std::error_code_&)>::
  callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
  ::callable_impl(this_00,&local_48);
  *(callable_impl<void,_cppcms::util::details::binderX<cppcms::session_pool::gc_job,_std::shared_ptr<cppcms::session_pool::gc_job>,_const_std::error_code_&>_>
    **)this = this_00;
  booster::atomic_counter::inc();
  if (local_48.object.super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.object.
               super___shared_ptr<cppcms::session_pool::gc_job,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

callback(F func) : call_ptr(new callable_impl<Result,F>(func)) 	
		{}